

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

uint256 * ParseHashV(uint256 *__return_storage_ptr__,UniValue *v,string_view name)

{
  pointer pcVar1;
  size_type sVar2;
  base_blob<256U> *pbVar3;
  bool bVar4;
  string *args;
  UniValue *pUVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  size_type local_60;
  undefined1 local_54 [20];
  string local_40;
  long local_20;
  
  local_54._12_8_ = name._M_str;
  local_54._4_8_ = name._M_len;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  args = UniValue::get_str_abi_cxx11_(v);
  if (args->_M_string_length == 0x40) {
    str._M_str = (args->_M_dataplus)._M_p;
    str._M_len = 0x40;
    bVar4 = IsHex(str);
    if (bVar4) {
      pcVar1 = (args->_M_dataplus)._M_p;
      sVar2 = args->_M_string_length;
      pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
      (pbVar3->m_data)._M_elems[0x10] = '\0';
      (pbVar3->m_data)._M_elems[0x11] = '\0';
      (pbVar3->m_data)._M_elems[0x12] = '\0';
      (pbVar3->m_data)._M_elems[0x13] = '\0';
      (pbVar3->m_data)._M_elems[0x14] = '\0';
      (pbVar3->m_data)._M_elems[0x15] = '\0';
      (pbVar3->m_data)._M_elems[0x16] = '\0';
      (pbVar3->m_data)._M_elems[0x17] = '\0';
      pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
      (pbVar3->m_data)._M_elems[0x18] = '\0';
      (pbVar3->m_data)._M_elems[0x19] = '\0';
      (pbVar3->m_data)._M_elems[0x1a] = '\0';
      (pbVar3->m_data)._M_elems[0x1b] = '\0';
      (pbVar3->m_data)._M_elems[0x1c] = '\0';
      (pbVar3->m_data)._M_elems[0x1d] = '\0';
      (pbVar3->m_data)._M_elems[0x1e] = '\0';
      (pbVar3->m_data)._M_elems[0x1f] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
      (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
      pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
      (pbVar3->m_data)._M_elems[8] = '\0';
      (pbVar3->m_data)._M_elems[9] = '\0';
      (pbVar3->m_data)._M_elems[10] = '\0';
      (pbVar3->m_data)._M_elems[0xb] = '\0';
      (pbVar3->m_data)._M_elems[0xc] = '\0';
      (pbVar3->m_data)._M_elems[0xd] = '\0';
      (pbVar3->m_data)._M_elems[0xe] = '\0';
      (pbVar3->m_data)._M_elems[0xf] = '\0';
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        str_00._M_str = pcVar1;
        str_00._M_len = sVar2;
        base_blob<256U>::SetHexDeprecated(&__return_storage_ptr__->super_base_blob<256U>,str_00);
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                (&local_40,(tinyformat *)"%s must be hexadecimal string (not \'%s\')",local_54 + 4,
                 (basic_string_view<char,_std::char_traits<char>_> *)args,in_R8);
      JSONRPCError(pUVar5,-8,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
    local_54._0_4_ = 0x40;
    local_60 = args->_M_string_length;
    tinyformat::
    format<std::basic_string_view<char,std::char_traits<char>>,int,unsigned_long,std::__cxx11::string>
              (&local_40,(tinyformat *)"%s must be of length %d (not %d, for \'%s\')",local_54 + 4,
               (basic_string_view<char,_std::char_traits<char>_> *)local_54,(int *)&local_60,
               (unsigned_long *)args,in_stack_ffffffffffffff98);
    JSONRPCError(pUVar5,-8,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint256 ParseHashV(const UniValue& v, std::string_view name)
{
    const std::string& strHex(v.get_str());
    if (64 != strHex.length())
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be of length %d (not %d, for '%s')", name, 64, strHex.length(), strHex));
    if (!IsHex(strHex)) // Note: IsHex("") is false
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
    return uint256S(strHex);
}